

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O2

void __thiscall
glcts::TestCaseBase::shaderSourceSpecialized
          (TestCaseBase *this,GLuint shader_id,GLsizei shader_count,GLchar **shader_string)

{
  int iVar1;
  undefined4 extraout_var;
  char *specialized_cstr;
  string specialized;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  specializeShader_abi_cxx11_(&specialized,this,shader_count,shader_string);
  specialized_cstr = specialized._M_dataplus._M_p;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x12b8))(shader_id,1,&specialized_cstr,0);
  std::__cxx11::string::~string((string *)&specialized);
  return;
}

Assistant:

void TestCaseBase::shaderSourceSpecialized(glw::GLuint shader_id, glw::GLsizei shader_count,
										   const glw::GLchar* const* shader_string)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	std::string specialized		 = specializeShader(shader_count, shader_string);
	const char* specialized_cstr = specialized.c_str();
	gl.shaderSource(shader_id, 1, &specialized_cstr, NULL);
}